

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.hpp
# Opt level: O1

void tf::detail::
     parallel_pdqsort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>,true>
               (undefined8 *rt,
               __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin,
               __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end,int param_4,
               byte param_5)

{
  int *piVar1;
  int *piVar2;
  int iVar3;
  long lVar4;
  bool bVar5;
  ulong uVar6;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var7;
  int *piVar8;
  int *piVar9;
  ulong uVar10;
  ulong uVar11;
  pair<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_bool> pVar12;
  _Iter_comp_iter<std::less<int>_> __cmp;
  int local_8c;
  DefaultTaskParams local_81;
  undefined8 *local_80;
  anon_class_64_6_4db4d30f local_78;
  
  local_8c = param_4;
  local_80 = rt;
  do {
    uVar11 = (long)end._M_current - (long)begin._M_current >> 2;
    if (uVar11 < 0x18) {
      if ((param_5 & 1) == 0) {
        piVar8 = begin._M_current + 1;
        _Var7._M_current = begin._M_current;
        if (piVar8 != end._M_current && begin._M_current != end._M_current) {
          do {
            iVar3 = _Var7._M_current[1];
            piVar9 = piVar8;
            if (iVar3 < *_Var7._M_current) {
              do {
                *piVar9 = piVar9[-1];
                piVar1 = piVar9 + -1;
                piVar2 = piVar9 + -2;
                piVar9 = piVar1;
              } while (iVar3 < *piVar2);
              *piVar1 = iVar3;
            }
            piVar9 = piVar8 + 1;
            _Var7._M_current = piVar8;
            piVar8 = piVar9;
          } while (piVar9 != end._M_current);
        }
      }
      else {
        insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
                  (begin._M_current,end._M_current);
      }
LAB_0012668e:
      bVar5 = true;
    }
    else {
      if (uVar11 < 0x1001) {
        if (begin._M_current != end._M_current) {
          lVar4 = 0x3f;
          if (uVar11 != 0) {
            for (; uVar11 >> lVar4 == 0; lVar4 = lVar4 + -1) {
            }
          }
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<std::less<int>>>
                    (begin._M_current,end._M_current,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::less<int>>>
                    (begin._M_current,end._M_current);
        }
        goto LAB_0012668e;
      }
      uVar6 = uVar11 >> 1;
      iVar3 = *begin._M_current;
      if (begin._M_current[uVar6] < iVar3) {
        *begin._M_current = begin._M_current[uVar6];
        begin._M_current[uVar6] = iVar3;
      }
      iVar3 = begin._M_current[uVar6];
      if (end._M_current[-1] < iVar3) {
        begin._M_current[uVar6] = end._M_current[-1];
        end._M_current[-1] = iVar3;
      }
      iVar3 = *begin._M_current;
      if (begin._M_current[uVar6] < iVar3) {
        *begin._M_current = begin._M_current[uVar6];
        begin._M_current[uVar6] = iVar3;
      }
      iVar3 = begin._M_current[1];
      if (begin._M_current[uVar6 - 1] < iVar3) {
        begin._M_current[1] = begin._M_current[uVar6 - 1];
        begin._M_current[uVar6 - 1] = iVar3;
      }
      iVar3 = begin._M_current[uVar6 - 1];
      if (end._M_current[-2] < iVar3) {
        begin._M_current[uVar6 - 1] = end._M_current[-2];
        end._M_current[-2] = iVar3;
      }
      iVar3 = begin._M_current[1];
      if (begin._M_current[uVar6 - 1] < iVar3) {
        begin._M_current[1] = begin._M_current[uVar6 - 1];
        begin._M_current[uVar6 - 1] = iVar3;
      }
      iVar3 = begin._M_current[2];
      if (begin._M_current[uVar6 + 1] < iVar3) {
        begin._M_current[2] = begin._M_current[uVar6 + 1];
        begin._M_current[uVar6 + 1] = iVar3;
      }
      iVar3 = begin._M_current[uVar6 + 1];
      if (end._M_current[-3] < iVar3) {
        begin._M_current[uVar6 + 1] = end._M_current[-3];
        end._M_current[-3] = iVar3;
      }
      iVar3 = begin._M_current[2];
      if (begin._M_current[uVar6 + 1] < iVar3) {
        begin._M_current[2] = begin._M_current[uVar6 + 1];
        begin._M_current[uVar6 + 1] = iVar3;
      }
      iVar3 = begin._M_current[uVar6 - 1];
      if (begin._M_current[uVar6] < iVar3) {
        begin._M_current[uVar6 - 1] = begin._M_current[uVar6];
        begin._M_current[uVar6] = iVar3;
      }
      iVar3 = begin._M_current[uVar6];
      if (begin._M_current[uVar6 + 1] < iVar3) {
        begin._M_current[uVar6] = begin._M_current[uVar6 + 1];
        begin._M_current[uVar6 + 1] = iVar3;
      }
      iVar3 = begin._M_current[uVar6 - 1];
      if (begin._M_current[uVar6] < iVar3) {
        begin._M_current[uVar6 - 1] = begin._M_current[uVar6];
        begin._M_current[uVar6] = iVar3;
      }
      iVar3 = *begin._M_current;
      *begin._M_current = begin._M_current[uVar6];
      begin._M_current[uVar6] = iVar3;
      if (((param_5 & 1) == 0) && (*begin._M_current <= begin._M_current[-1])) {
        begin = partition_left<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
                          (begin._M_current,end._M_current);
        begin._M_current = begin._M_current + 1;
        bVar5 = false;
      }
      else {
        pVar12 = partition_right_branchless<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
                           (begin._M_current,end._M_current);
        _Var7 = pVar12.first._M_current;
        uVar10 = (long)_Var7._M_current - (long)begin._M_current >> 2;
        piVar8 = _Var7._M_current + 1;
        uVar6 = (long)end._M_current - (long)piVar8 >> 2;
        if ((uVar10 < uVar11 >> 3) || (uVar6 < uVar11 >> 3)) {
          local_8c = local_8c + -1;
          if (local_8c == 0) {
            std::
            __make_heap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::less<int>>>
                      (begin,end,(_Iter_comp_iter<std::less<int>_> *)&local_78);
            std::
            __sort_heap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::less<int>>>
                      (begin,end,(_Iter_comp_iter<std::less<int>_> *)&local_78);
            local_8c = 0;
            goto LAB_00126a13;
          }
          if (0x17 < uVar10) {
            uVar11 = uVar10 & 0xfffffffffffffffc;
            iVar3 = *begin._M_current;
            *begin._M_current = *(begin._M_current + uVar11);
            *(begin._M_current + uVar11) = iVar3;
            iVar3 = _Var7._M_current[-1];
            _Var7._M_current[-1] = *(_Var7._M_current - uVar11);
            *(_Var7._M_current - uVar11) = iVar3;
            if (0x80 < uVar10) {
              uVar10 = uVar10 >> 2;
              iVar3 = begin._M_current[1];
              begin._M_current[1] = begin._M_current[uVar10 + 1];
              begin._M_current[uVar10 + 1] = iVar3;
              iVar3 = begin._M_current[2];
              begin._M_current[2] = begin._M_current[uVar10 + 2];
              begin._M_current[uVar10 + 2] = iVar3;
              iVar3 = _Var7._M_current[-2];
              _Var7._M_current[-2] = _Var7._M_current[~uVar10];
              _Var7._M_current[~uVar10] = iVar3;
              iVar3 = _Var7._M_current[-3];
              _Var7._M_current[-3] = _Var7._M_current[-2 - uVar10];
              _Var7._M_current[-2 - uVar10] = iVar3;
            }
          }
          if (0x17 < uVar6) {
            uVar11 = uVar6 & 0xfffffffffffffffc;
            iVar3 = _Var7._M_current[1];
            _Var7._M_current[1] = *(_Var7._M_current + uVar11 + 4);
            *(_Var7._M_current + uVar11 + 4) = iVar3;
            iVar3 = end._M_current[-1];
            end._M_current[-1] = *(end._M_current - uVar11);
            *(end._M_current - uVar11) = iVar3;
            if (0x80 < uVar6) {
              uVar6 = uVar6 >> 2;
              iVar3 = _Var7._M_current[2];
              _Var7._M_current[2] = _Var7._M_current[uVar6 + 2];
              _Var7._M_current[uVar6 + 2] = iVar3;
              iVar3 = _Var7._M_current[3];
              _Var7._M_current[3] = _Var7._M_current[uVar6 + 3];
              _Var7._M_current[uVar6 + 3] = iVar3;
              iVar3 = end._M_current[-2];
              end._M_current[-2] = end._M_current[~uVar6];
              end._M_current[~uVar6] = iVar3;
              iVar3 = end._M_current[-3];
              end._M_current[-3] = end._M_current[-2 - uVar6];
              end._M_current[-2 - uVar6] = iVar3;
            }
          }
        }
        else if (((((undefined1  [16])pVar12 & (undefined1  [16])0x1) != (undefined1  [16])0x0) &&
                 (bVar5 = partial_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
                                    (begin._M_current,_Var7._M_current), bVar5)) &&
                (bVar5 = partial_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
                                   (piVar8,end._M_current), bVar5)) {
LAB_00126a13:
          bVar5 = true;
          goto LAB_00126691;
        }
        local_78.rt._executor = (Executor *)*local_80;
        local_78.rt._17_8_ = *(undefined8 *)((long)local_80 + 0x11);
        local_78.rt._parent._0_1_ = (undefined1)((ulong)*(undefined8 *)((long)local_80 + 9) >> 0x38)
        ;
        local_78.rt._worker._0_1_ = (undefined1)local_80[1];
        local_78.rt._worker._1_7_ = (undefined7)((ulong)local_80[1] >> 8);
        local_78.bad_allowed = local_8c;
        local_78.leftmost = (bool)(param_5 & 1);
        LOCK();
        *(long *)(local_80[2] + 0x80) = *(long *)(local_80[2] + 0x80) + 1;
        UNLOCK();
        local_78.begin._M_current = begin._M_current;
        local_78.pivot_pos._M_current = _Var7._M_current;
        Executor::
        _silent_async<tf::DefaultTaskParams,tf::detail::parallel_pdqsort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>,true>(tf::Runtime&,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>,int,bool)::_lambda()_1_>
                  ((Executor *)*local_80,&local_81,&local_78,((Node *)local_80[2])->_topology,
                   (Node *)local_80[2]);
        bVar5 = false;
        param_5 = 0;
        begin._M_current = piVar8;
      }
    }
LAB_00126691:
    if (bVar5) {
      return;
    }
  } while( true );
}

Assistant:

void parallel_pdqsort(
  Runtime& rt,
  Iter begin, Iter end, Compare comp,
  int bad_allowed, bool leftmost = true
) {

  // Partitions below this size are sorted sequentially
  constexpr auto cutoff = parallel_sort_cutoff<Iter>();

  // Partitions below this size are sorted using insertion sort
  constexpr auto insertion_sort_threshold = 24;

  // Partitions above this size use Tukey's ninther to select the pivot.
  constexpr auto ninther_threshold = 128;

  //using diff_t = typename std::iterator_traits<Iter>::difference_type;

  // Use a while loop for tail recursion elimination.
  while (true) {

    //diff_t size = end - begin;
    size_t size = end - begin;

    // Insertion sort is faster for small arrays.
    if (size < insertion_sort_threshold) {
      if (leftmost) {
        insertion_sort(begin, end, comp);
      }
      else {
        unguarded_insertion_sort(begin, end, comp);
      }
      return;
    }

    if(size <= cutoff) {
      std::sort(begin, end, comp);
      return;
    }

    // Choose pivot as median of 3 or pseudomedian of 9.
    //diff_t s2 = size / 2;
    size_t s2 = size >> 1;
    if (size > ninther_threshold) {
      sort3(begin, begin + s2, end - 1, comp);
      sort3(begin + 1, begin + (s2 - 1), end - 2, comp);
      sort3(begin + 2, begin + (s2 + 1), end - 3, comp);
      sort3(begin + (s2 - 1), begin + s2, begin + (s2 + 1), comp);
      std::iter_swap(begin, begin + s2);
    }
    else {
      sort3(begin + s2, begin, end - 1, comp);
    }

    // If *(begin - 1) is the end of the right partition
    // of a previous partition operation, there is no element in [begin, end)
    // that is smaller than *(begin - 1).
    // Then if our pivot compares equal to *(begin - 1) we change strategy,
    // putting equal elements in the left partition,
    // greater elements in the right partition.
    // We do not have to recurse on the left partition,
    // since it's sorted (all equal).
    if (!leftmost && !comp(*(begin - 1), *begin)) {
      begin = partition_left(begin, end, comp) + 1;
      continue;
    }

    // Partition and get results.
    const auto pair = Branchless ? partition_right_branchless(begin, end, comp) :
                                   partition_right(begin, end, comp);
       
    const auto pivot_pos = pair.first;
    const auto already_partitioned = pair.second;

    // Check for a highly unbalanced partition.
    //diff_t l_size = pivot_pos - begin;
    //diff_t r_size = end - (pivot_pos + 1);
    const size_t l_size = pivot_pos - begin;
    const size_t r_size = end - (pivot_pos + 1);
    const bool highly_unbalanced = l_size < size / 8 || r_size < size / 8;

    // If we got a highly unbalanced partition we shuffle elements
    // to break many patterns.
    if (highly_unbalanced) {
      // If we had too many bad partitions, switch to heapsort
      // to guarantee O(n log n).
      if (--bad_allowed == 0) {
        std::make_heap(begin, end, comp);
        std::sort_heap(begin, end, comp);
        return;
      }

      if (l_size >= insertion_sort_threshold) {
        std::iter_swap(begin, begin + l_size / 4);
        std::iter_swap(pivot_pos - 1, pivot_pos - l_size / 4);
        if (l_size > ninther_threshold) {
          std::iter_swap(begin + 1, begin + (l_size / 4 + 1));
          std::iter_swap(begin + 2, begin + (l_size / 4 + 2));
          std::iter_swap(pivot_pos - 2, pivot_pos - (l_size / 4 + 1));
          std::iter_swap(pivot_pos - 3, pivot_pos - (l_size / 4 + 2));
        }
      }

      if (r_size >= insertion_sort_threshold) {
        std::iter_swap(pivot_pos + 1, pivot_pos + (1 + r_size / 4));
        std::iter_swap(end - 1,                   end - r_size / 4);
        if (r_size > ninther_threshold) {
          std::iter_swap(pivot_pos + 2, pivot_pos + (2 + r_size / 4));
          std::iter_swap(pivot_pos + 3, pivot_pos + (3 + r_size / 4));
          std::iter_swap(end - 2,             end - (1 + r_size / 4));
          std::iter_swap(end - 3,             end - (2 + r_size / 4));
        }
      }
    }
    // decently balanced
    else {
      // sequence try to use insertion sort.
      if (already_partitioned &&
          partial_insertion_sort(begin, pivot_pos, comp) &&
          partial_insertion_sort(pivot_pos + 1, end, comp)
      ) {
        return;
      }
    }

    // Sort the left partition first using recursion and
    // do tail recursion elimination for the right-hand partition.
    // here we need to copy runtime so it stays alive during the sort recursion
    rt.silent_async([=] () mutable {
      parallel_pdqsort<Iter, Compare, Branchless>(
        rt, begin, pivot_pos, comp, bad_allowed, leftmost
      );
    });
    begin = pivot_pos + 1;
    leftmost = false;
  }
}